

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void pybind11::detail::keep_alive_impl(handle nurse,handle patient)

{
  PyTypeObject *type;
  iterator __position;
  internals *piVar1;
  vector<_object*,std::allocator<_object*>> *this;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar2;
  undefined1 local_50 [8];
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> tinfo;
  weakref wr;
  cpp_function disable_lifesupport;
  
  if ((nurse.m_ptr != (PyObject *)0x0) && (patient.m_ptr != (PyObject *)0x0)) {
    if (nurse.m_ptr != (PyObject *)&_Py_NoneStruct && patient.m_ptr != (PyObject *)&_Py_NoneStruct)
    {
      type = (nurse.m_ptr)->ob_type;
      pVar2 = all_type_info_get_cache(type);
      if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        all_type_info_populate
                  (type,(vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                         *)((long)pVar2.first.
                                  super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                  ._M_cur.
                                  super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                           + 0x10));
      }
      std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::
      vector((vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              *)local_50,
             (vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              *)((long)pVar2.first.
                       super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                       ._M_cur.
                       super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                + 0x10));
      tinfo.
      super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)patient.m_ptr;
      if (local_50 ==
          (undefined1  [8])
          tinfo.
          super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        cpp_function::
        cpp_function<pybind11::detail::keep_alive_impl(pybind11::handle,pybind11::handle)::_lambda(pybind11::handle)_1_,,void>
                  ((cpp_function *)&wr,
                   (type *)&tinfo.
                            super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        weakref::weakref((weakref *)
                         &tinfo.
                          super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,nurse,
                         (handle)wr.super_object.super_handle.m_ptr);
        (patient.m_ptr)->ob_refcnt = (patient.m_ptr)->ob_refcnt + 1;
        tinfo.
        super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        object::~object((object *)
                        &tinfo.
                         super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        object::~object(&wr.super_object);
      }
      else {
        wr.super_object.super_handle.m_ptr = (object)(object)nurse.m_ptr;
        piVar1 = get_internals();
        *(byte *)&nurse.m_ptr[3].ob_refcnt = (byte)nurse.m_ptr[3].ob_refcnt | 0x10;
        (patient.m_ptr)->ob_refcnt = (patient.m_ptr)->ob_refcnt + 1;
        this = (vector<_object*,std::allocator<_object*>> *)
               std::__detail::
               _Map_base<const__object_*,_std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_std::allocator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const__object_*>,_std::hash<const__object_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const__object_*,_std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_std::allocator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const__object_*>,_std::hash<const__object_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&piVar1->patients,(key_type *)&wr);
        __position._M_current = *(_object ***)(this + 8);
        if (__position._M_current == *(_object ***)(this + 0x10)) {
          std::vector<_object*,std::allocator<_object*>>::_M_realloc_insert<_object*const&>
                    (this,__position,
                     (_object **)
                     &tinfo.
                      super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          *__position._M_current = patient.m_ptr;
          *(long *)(this + 8) = *(long *)(this + 8) + 8;
        }
      }
      if (local_50 != (undefined1  [8])0x0) {
        operator_delete((void *)local_50,
                        (long)tinfo.
                              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)local_50);
      }
    }
    return;
  }
  pybind11_fail("Could not activate keep_alive!");
}

Assistant:

inline void keep_alive_impl(handle nurse, handle patient) {
    if (!nurse || !patient)
        pybind11_fail("Could not activate keep_alive!");

    if (patient.is_none() || nurse.is_none())
        return; /* Nothing to keep alive or nothing to be kept alive by */

    auto tinfo = all_type_info(Py_TYPE(nurse.ptr()));
    if (!tinfo.empty()) {
        /* It's a pybind-registered type, so we can store the patient in the
         * internal list. */
        add_patient(nurse.ptr(), patient.ptr());
    }
    else {
        /* Fall back to clever approach based on weak references taken from
         * Boost.Python. This is not used for pybind-registered types because
         * the objects can be destroyed out-of-order in a GC pass. */
        cpp_function disable_lifesupport(
            [patient](handle weakref) { patient.dec_ref(); weakref.dec_ref(); });

        weakref wr(nurse, disable_lifesupport);

        patient.inc_ref(); /* reference patient and leak the weak reference */
        (void) wr.release();
    }
}